

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_Dyy_top(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *in_RSI;
  int *in_RDI;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  int j_6;
  int i_6;
  int j_5;
  int i_5;
  int j_4;
  int i_4;
  int j_3;
  int i_3;
  int j_2;
  int i_2;
  int j_1;
  int i_1;
  int j;
  int i;
  int iwidth;
  int iheight;
  float *data;
  int ind;
  float inv_area;
  int border;
  int lobe;
  int width;
  int height;
  int filter_size;
  int step;
  int data_width;
  bool *laplacian;
  float *response;
  float temp1;
  float temp0;
  float D;
  float C;
  float B;
  float A;
  float Dyy1;
  float Dyy0;
  int c11;
  int c10;
  int r11;
  int r10;
  int c01;
  int c00;
  int r01;
  int r00;
  int k0;
  int k;
  int y;
  int x;
  float Dxy;
  float Dyy;
  float Dxx;
  float in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  float in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_a4;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  
  lVar6 = *(long *)(in_RDI + 4);
  lVar7 = *(long *)(in_RDI + 6);
  iVar1 = in_RSI[4];
  iVar2 = in_RDI[3];
  iVar3 = *in_RDI;
  iVar4 = in_RDI[2];
  iVar5 = in_RDI[1];
  iVar12 = iVar3 / 3;
  iVar13 = (iVar3 + -1) / 2;
  fVar17 = 1.0 / (float)(iVar3 * iVar3);
  lVar8 = *(long *)(in_RSI + 2);
  iVar3 = *in_RSI;
  for (local_bc = 0; local_bc < iVar12 / 2 + 1; local_bc = iVar2 + local_bc) {
    local_a4 = (local_bc / iVar2) * iVar5;
    for (local_c0 = 0; local_c0 < iVar12; local_c0 = iVar2 + local_c0) {
      auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416(*(uint *)(lVar8 + (long)((~(iVar12 / 2) + local_bc + iVar12)
                                                                 * iVar1 + local_c0 + -1 + iVar12) *
                                                          4)),
                                ZEXT416(*(uint *)(lVar8 + (long)((local_bc + iVar13) * iVar1 +
                                                                local_c0 + -1 + iVar12) * 4)));
      fVar18 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar23._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar23._4_60_ = extraout_var;
      auVar11 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar23._0_16_,ZEXT416((uint)fVar18));
      fVar19 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar20 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar21 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar22 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar18 = auVar11._0_4_ * fVar17;
      fVar9 = auVar10._0_4_ * fVar17;
      fVar19 = (((fVar19 + fVar20) - fVar21) - fVar22) * fVar17;
      auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(fVar19 * 0.81 * fVar19)));
      *(int *)(lVar6 + (long)local_a4 * 4) = auVar10._0_4_;
      *(byte *)(lVar7 + local_a4) = (fVar18 + fVar9 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  for (local_c4 = ((iVar12 / 2 + iVar2) / iVar2) * iVar2; local_c4 < iVar13 + 1;
      local_c4 = iVar2 + local_c4) {
    local_a4 = (local_c4 / iVar2) * iVar5;
    for (local_c8 = 0; local_c8 < iVar12; local_c8 = iVar2 + local_c8) {
      iVar14 = ~(iVar12 / 2) + local_c4;
      iVar15 = local_c8 + -1 + iVar12;
      auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(*(float *)(lVar8 + (long)((iVar14 + iVar12) * iVar1 +
                                                                        iVar15) * 4) -
                                              *(float *)(lVar8 + (long)(iVar14 * iVar1 + iVar15) * 4
                                                        ))),
                                ZEXT416(*(uint *)(lVar8 + (long)((local_c4 + iVar13) * iVar1 +
                                                                local_c8 + -1 + iVar12) * 4)));
      in_stack_fffffffffffffee4 =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar24._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar24._4_60_ = extraout_var_00;
      auVar11 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar24._0_16_,
                                ZEXT416((uint)in_stack_fffffffffffffee4));
      fVar19 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar20 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar21 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar22 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar18 = auVar11._0_4_ * fVar17;
      fVar9 = auVar10._0_4_ * fVar17;
      fVar19 = (((fVar19 + fVar20) - fVar21) - fVar22) * fVar17;
      auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(fVar19 * 0.81 * fVar19)));
      *(int *)(lVar6 + (long)local_a4 * 4) = auVar10._0_4_;
      *(byte *)(lVar7 + local_a4) = (fVar18 + fVar9 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  iVar15 = ((iVar12 + iVar2 + -1) / iVar2) * iVar2;
  for (local_cc = 0; local_cc < iVar12 / 2 + 1; local_cc = iVar2 + local_cc) {
    in_stack_fffffffffffffedc = (local_cc / iVar2) * iVar5;
    local_a4 = in_stack_fffffffffffffedc + iVar15 / iVar2;
    iVar14 = local_cc;
    for (local_d0 = iVar15; local_d0 < (iVar5 * iVar2 - iVar12) + 1; local_d0 = iVar2 + local_d0) {
      iVar16 = ~(iVar12 / 2) + local_cc + iVar12;
      auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(*(float *)(lVar8 + (long)(iVar16 * iVar1 +
                                                                        local_d0 + -1 + iVar12) * 4)
                                              - *(float *)(lVar8 + (long)(iVar16 * iVar1 +
                                                                         (local_d0 - iVar12)) * 4)))
                                ,ZEXT416((uint)(*(float *)(lVar8 + (long)((local_cc + iVar13) *
                                                                          iVar1 + local_d0 + -1 +
                                                                                  iVar12) * 4) -
                                               *(float *)(lVar8 + (long)((local_cc + iVar13) * iVar1
                                                                        + (local_d0 - iVar12)) * 4))
                                        ));
      fVar18 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,iVar14),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar25._0_4_ =
           box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,iVar14),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar25._4_60_ = extraout_var_01;
      auVar11 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar25._0_16_,ZEXT416((uint)fVar18));
      in_stack_fffffffffffffed0 =
           box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,iVar14),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar18 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,iVar14),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffed4 = in_stack_fffffffffffffed0 + fVar18;
      fVar18 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,iVar14),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffed8 = in_stack_fffffffffffffed4 - fVar18;
      fVar19 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,iVar14),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar18 = auVar11._0_4_ * fVar17;
      fVar9 = auVar10._0_4_ * fVar17;
      fVar19 = (in_stack_fffffffffffffed8 - fVar19) * fVar17;
      auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(fVar19 * 0.81 * fVar19)));
      *(int *)(lVar6 + (long)local_a4 * 4) = auVar10._0_4_;
      *(byte *)(lVar7 + local_a4) = (fVar18 + fVar9 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  for (local_d4 = ((iVar12 / 2 + iVar2) / iVar2) * iVar2; local_d4 < iVar13 + 1;
      local_d4 = iVar2 + local_d4) {
    local_a4 = (local_d4 / iVar2) * iVar5 + iVar15 / iVar2;
    for (local_d8 = iVar15; local_d8 < (iVar5 * iVar2 - iVar12) + 1; local_d8 = iVar2 + local_d8) {
      iVar16 = ~(iVar12 / 2) + local_d4;
      iVar14 = local_d8 + -1 + iVar12;
      auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)((*(float *)(lVar8 + (long)(iVar16 * iVar1 +
                                                                         (local_d8 - iVar12)) * 4) -
                                               *(float *)(lVar8 + (long)((iVar16 + iVar12) * iVar1 +
                                                                        (local_d8 - iVar12)) * 4)) +
                                              (*(float *)(lVar8 + (long)((iVar16 + iVar12) * iVar1 +
                                                                        iVar14) * 4) -
                                              *(float *)(lVar8 + (long)(iVar16 * iVar1 + iVar14) * 4
                                                        )))),
                                ZEXT416((uint)(*(float *)(lVar8 + (long)((local_d4 + iVar13) * iVar1
                                                                        + local_d8 + -1 + iVar12) *
                                                                  4) -
                                              *(float *)(lVar8 + (long)((local_d4 + iVar13) * iVar1
                                                                       + (local_d8 - iVar12)) * 4)))
                               );
      fVar18 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar26._0_4_ =
           box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar26._4_60_ = extraout_var_02;
      auVar11 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar26._0_16_,ZEXT416((uint)fVar18));
      fVar19 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar20 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar21 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar22 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar18 = auVar11._0_4_ * fVar17;
      fVar9 = auVar10._0_4_ * fVar17;
      fVar19 = (((fVar19 + fVar20) - fVar21) - fVar22) * fVar17;
      auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(fVar19 * 0.81 * fVar19)));
      *(int *)(lVar6 + (long)local_a4 * 4) = auVar10._0_4_;
      *(byte *)(lVar7 + local_a4) = (fVar18 + fVar9 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  iVar15 = (((iVar5 * iVar2 - iVar12) + iVar2) / iVar2) * iVar2;
  for (local_dc = 0; local_dc < iVar12 / 2 + 1; local_dc = iVar2 + local_dc) {
    local_a4 = (local_dc / iVar2) * iVar5 + iVar15 / iVar2;
    for (local_e0 = iVar15; local_e0 < iVar5 * iVar2; local_e0 = iVar2 + local_e0) {
      iVar14 = ~(iVar12 / 2) + local_dc + iVar12;
      auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(*(float *)(lVar8 + (long)(iVar14 * iVar1 + -1 + iVar3
                                                                        ) * 4) -
                                              *(float *)(lVar8 + (long)(iVar14 * iVar1 +
                                                                       (local_e0 - iVar12)) * 4))),
                                ZEXT416((uint)(*(float *)(lVar8 + (long)((local_dc + iVar13) * iVar1
                                                                         + -1 + iVar3) * 4) -
                                              *(float *)(lVar8 + (long)((local_dc + iVar13) * iVar1
                                                                       + (local_e0 - iVar12)) * 4)))
                               );
      fVar18 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar27._0_4_ =
           box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar27._4_60_ = extraout_var_03;
      auVar11 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar27._0_16_,ZEXT416((uint)fVar18));
      fVar19 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar20 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar21 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar22 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar18 = auVar11._0_4_ * fVar17;
      fVar9 = auVar10._0_4_ * fVar17;
      fVar19 = (((fVar19 + fVar20) - fVar21) - fVar22) * fVar17;
      auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(fVar19 * 0.81 * fVar19)));
      *(int *)(lVar6 + (long)local_a4 * 4) = auVar10._0_4_;
      *(byte *)(lVar7 + local_a4) = (fVar18 + fVar9 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  for (local_e4 = ((iVar12 / 2 + iVar2) / iVar2) * iVar2; local_e4 < iVar13 + 1;
      local_e4 = iVar2 + local_e4) {
    local_a4 = (local_e4 / iVar2) * iVar5 + iVar15 / iVar2;
    for (local_e8 = iVar15; local_e8 < iVar5 * iVar2; local_e8 = iVar2 + local_e8) {
      iVar14 = ~(iVar12 / 2) + local_e4;
      vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                      ZEXT416((uint)((*(float *)(lVar8 + (long)(iVar14 * iVar1 + (local_e8 - iVar12)
                                                               ) * 4) -
                                     *(float *)(lVar8 + (long)((iVar14 + iVar12) * iVar1 +
                                                              (local_e8 - iVar12)) * 4)) +
                                    (*(float *)(lVar8 + (long)((iVar14 + iVar12) * iVar1 + -1 +
                                                              iVar3) * 4) -
                                    *(float *)(lVar8 + (long)(iVar14 * iVar1 + -1 + iVar3) * 4)))),
                      ZEXT416((uint)(*(float *)(lVar8 + (long)((local_e4 + iVar13) * iVar1 + -1 +
                                                              iVar3) * 4) -
                                    *(float *)(lVar8 + (long)((local_e4 + iVar13) * iVar1 +
                                                             (local_e8 - iVar12)) * 4))));
      fVar18 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar28._0_4_ =
           box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar28._4_60_ = extraout_var_04;
      auVar10 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar28._0_16_,ZEXT416((uint)fVar18));
      fVar18 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar29._0_4_ =
           box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar29._4_60_ = extraout_var_05;
      auVar11 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar29._0_16_,ZEXT416((uint)fVar18));
      fVar19 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar20 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar21 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar22 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar18 = auVar10._0_4_ * fVar17;
      fVar9 = auVar11._0_4_ * fVar17;
      fVar19 = (((fVar19 + fVar20) - fVar21) - fVar22) * fVar17;
      auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(fVar19 * 0.81 * fVar19)));
      *(int *)(lVar6 + (long)local_a4 * 4) = auVar10._0_4_;
      *(byte *)(lVar7 + local_a4) = (fVar18 + fVar9 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  for (local_ec = ((iVar13 + iVar2) / iVar2) * iVar2; local_ec < iVar4 * iVar2;
      local_ec = iVar2 + local_ec) {
    local_a4 = (local_ec / iVar2) * iVar5;
    for (local_f0 = 0; local_f0 < iVar5 * iVar2; local_f0 = iVar2 + local_f0) {
      fVar18 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar30._0_4_ =
           box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar30._4_60_ = extraout_var_06;
      auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar30._0_16_,ZEXT416((uint)fVar18))
      ;
      fVar18 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar31._0_4_ =
           box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                        in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                        (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      auVar31._4_60_ = extraout_var_07;
      auVar11 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar31._0_16_,ZEXT416((uint)fVar18));
      fVar19 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar20 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar21 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar22 = box_integral((integral_image *)CONCAT44(in_stack_fffffffffffffee4,local_cc),
                            in_stack_fffffffffffffedc,(int)in_stack_fffffffffffffed8,
                            (int)in_stack_fffffffffffffed4,(int)in_stack_fffffffffffffed0);
      fVar18 = auVar10._0_4_ * fVar17;
      fVar9 = auVar11._0_4_ * fVar17;
      fVar19 = (((fVar19 + fVar20) - fVar21) - fVar22) * fVar17;
      auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(fVar19 * 0.81 * fVar19)));
      *(int *)(lVar6 + (long)local_a4 * 4) = auVar10._0_4_;
      *(byte *)(lVar7 + local_a4) = (fVar18 + fVar9 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  return;
}

Assistant:

void compute_response_layer_Dyy_top(struct response_layer* layer, struct integral_image* iimage) {
    /*
        base function: compute_response_layer_Dyy_leftcorner

        optimization:
        - Dyy box filter hand optimized and split into cases
            => here only top cases
    */
    float Dxx, Dyy, Dxy;
    int x, y, k, k0;
    int r00, r01, c00, c01, r10, r11, c10, c11;
    float Dyy0, Dyy1, A, B, C, D, temp0, temp1;

    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size*filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float*) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    // Top Left Corner - Case 1: B of neg part outside
    for (int i = 0; i < lobe / 2 + 1; i += step) {  // Inner B is outside, i.e. 0
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {  // c0 = col - 1 = (y - lobe + 1) -1 < 0
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;  // -1 is already part of r10
            c11 = y + lobe - 1;

            D = data[r11 * data_width + c11];
            Dyy1 = D;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Left Corner - Case 2: B of neg part inside
    // initial value has to be rounded up to next bigger step
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border + 1; i += step) {  // Inner B is inside
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // -1 is already part of r10
            c11 = y + lobe - 1;

            B = data[r10 * data_width + c11];
            D = data[r11 * data_width + c11];
            Dyy1 = D - B;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid - Case 1: B of neg part outside
    k0 = (lobe + step - 1) / step * step;  // initial y value to next multiple of step

    for (int i = 0; i < lobe / 2 + 1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step -lobe+1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            // A and B are outside (= 0), C and D inside
            r01 = x + border;
            c00 = y - lobe;
            c01 = y + lobe - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];
            Dyy0 = D - C;

            // neg part box filter
            // A and B are outside (= 0), C and D inside
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // r10 und r11 kann man vereinfachen
            c10 = y - lobe;
            c11 = y + lobe - 1;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];

            Dyy1 = D - C;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid - Case 2: B of neg part inside
    k = (lobe / 2 + 1 + step - 1) / step * step;  // round initial value to next highest step
    for (int i = k; i < border+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step -lobe+1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c00 = y - lobe;
            c01 = y + lobe - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;
            c11 = y + lobe - 1;

            A = data[r10 * data_width + c10];
            B = data[r10 * data_width + c11];
            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];

            temp0 = A - C;
            temp1 = D - B;
            Dyy1 = temp0 + temp1;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right - Case 1: A of neg part outside
    k0 = (width*step-lobe+1 + step - 1) / step * step;

    for (int i = 0; i < lobe/2+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // whole filter
            r01 = x + border;
            c00 = y - lobe;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];

            Dyy1 = D - C;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right - Case 2: A of neg part inside
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // whole filter
            r01 = x + border;
            c00 = y - lobe;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;

            A = data[r10 * data_width + c10];
            B = data[r10 * data_width + iwidth-1];
            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];

            temp0 = A - C;
            temp1 = D - B;
            Dyy1 = temp0 + temp1;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (border + 1 + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}